

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void bitset_container_printf(bitset_container_t *v)

{
  long lVar1;
  uint uVar2;
  char *__format;
  bool bVar3;
  int i;
  long lVar4;
  uint64_t uVar5;
  
  putchar(0x7b);
  bVar3 = true;
  lVar4 = 0;
  uVar2 = 0;
  do {
    uVar5 = v->words[lVar4];
    if (uVar5 != 0) {
      __format = ",%u";
      if (bVar3) {
        __format = "%u";
      }
      do {
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        bVar3 = false;
        printf(__format,(ulong)((uint)lVar1 | uVar2));
        uVar5 = uVar5 & uVar5 - 1;
        __format = ",%u";
      } while (uVar5 != 0);
    }
    uVar2 = uVar2 + 0x40;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x400);
  putchar(0x7d);
  return;
}

Assistant:

void bitset_container_printf(const bitset_container_t * v) {
	printf("{");
	uint32_t base = 0;
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = __builtin_ctzll(w);
			if(iamfirst) {// predicted to be false
				printf("%u",base + r);
				iamfirst = false;
			} else {
				printf(",%u",base + r);
			}
			w ^= t;
		}
		base += 64;
	}
	printf("}");
}